

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall
GraphTestPhonySelfReferenceError::~GraphTestPhonySelfReferenceError
          (GraphTestPhonySelfReferenceError *this)

{
  GraphTestPhonySelfReferenceError *this_local;
  
  ~GraphTestPhonySelfReferenceError(this);
  operator_delete(this,0x230);
  return;
}

Assistant:

TEST_F(GraphTest, PhonySelfReferenceError) {
  ManifestParserOptions parser_opts;
  parser_opts.phony_cycle_action_ = kPhonyCycleActionError;
  AssertParse(&state_,
"build a: phony a\n",
  parser_opts);

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("a"), NULL, &err));
  ASSERT_EQ("dependency cycle: a -> a [-w phonycycle=err]", err);
}